

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O1

void __thiscall ON_HistoryRecord::Dump(ON_HistoryRecord *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_UUID *uuid;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  ON_SimpleArray<ON_UUID_struct> uuid_list;
  ON_SimpleArray<ON_UUID_struct> local_40;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,text_log);
  local_40._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819000;
  local_40.m_a = (ON_UUID_struct *)0x0;
  local_40.m_count = 0;
  local_40.m_capacity = 0;
  ON_TextLog::Print(text_log,"Command ID: ");
  ON_TextLog::Print(text_log,&this->m_command_id);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"Version %d\n",(ulong)(uint)this->m_version);
  ON_TextLog::Print(text_log,"Record ID: ");
  uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
  ON_TextLog::Print(text_log,uuid);
  ON_TextLog::Print(text_log,"\n");
  pcVar2 = "history parameters";
  if (this->m_record_type == feature_parameters) {
    pcVar2 = "feature parameters";
  }
  ON_TextLog::Print(text_log,"Record type: %s\n",pcVar2);
  if (-1 < (long)local_40._16_8_) {
    local_40._16_8_ = local_40._16_8_ & 0xffffffff00000000;
  }
  ON_UuidList::GetUuids(&this->m_antecedents,&local_40);
  uVar3 = local_40._16_8_ & 0xffffffff;
  if (local_40.m_count < 1) {
    ON_TextLog::Print(text_log,"No antededents.\n");
  }
  else {
    ON_TextLog::Print(text_log,"Antededent ID:\n");
    ON_TextLog::PushIndent(text_log);
    lVar4 = 0;
    do {
      ON_TextLog::Print(text_log,(ON_UUID *)((local_40.m_a)->Data4 + lVar4 + -8));
      ON_TextLog::Print(text_log,"\n");
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
    ON_TextLog::PopIndent(text_log);
  }
  if (-1 < (long)local_40._16_8_) {
    local_40._16_8_ = local_40._16_8_ & 0xffffffff00000000;
  }
  ON_UuidList::GetUuids(&this->m_descendants,&local_40);
  uVar3 = local_40._16_8_ & 0xffffffff;
  if (local_40.m_count < 1) {
    ON_TextLog::Print(text_log,"No descendants.\n");
  }
  else {
    ON_TextLog::Print(text_log,"Descendant ID:\n");
    ON_TextLog::PushIndent(text_log);
    lVar4 = 0;
    do {
      ON_TextLog::Print(text_log,(ON_UUID *)((local_40.m_a)->Data4 + lVar4 + -8));
      ON_TextLog::Print(text_log,"\n");
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
    ON_TextLog::PopIndent(text_log);
  }
  ON_TextLog::Print(text_log,"Values:\n");
  ON_TextLog::PushIndent(text_log);
  iVar1 = ValueReport(this,text_log);
  if (iVar1 == 0) {
    ON_TextLog::Print(text_log,"none\n");
  }
  ON_TextLog::PopIndent(text_log);
  ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray(&local_40);
  return;
}

Assistant:

void ON_HistoryRecord::Dump( ON_TextLog& text_log ) const
{
  ON_ModelComponent::Dump(text_log);

  int i, count;
  ON_SimpleArray<ON_UUID> uuid_list;

  text_log.Print("Command ID: ");
  text_log.Print(m_command_id);
  text_log.Print("\n");

  text_log.Print("Version %d\n",m_version);

  text_log.Print("Record ID: ");
  text_log.Print(Id());
  text_log.Print("\n");

  text_log.Print("Record type: %s\n",
                 (m_record_type == ON_HistoryRecord::RECORD_TYPE::feature_parameters) 
                 ? "feature parameters" : "history parameters");

  // list antecedents
  uuid_list.SetCount(0);
  m_antecedents.GetUuids(uuid_list);
  count = uuid_list.Count();
  if ( count <= 0 )
  {
    text_log.Print("No antededents.\n");
  }
  else
  {
    text_log.Print("Antededent ID:\n");
    text_log.PushIndent();
    for ( i = 0; i < count; i++ )
    {
      text_log.Print(uuid_list[i]);
      text_log.Print("\n");
    }
    text_log.PopIndent();
  }

  // list descendants
  uuid_list.SetCount(0);
  m_descendants.GetUuids(uuid_list);
  count = uuid_list.Count();
  if ( count <= 0 )
  {
    text_log.Print("No descendants.\n");
  }
  else
  {
    text_log.Print("Descendant ID:\n");
    text_log.PushIndent();
    for ( i = 0; i < count; i++ )
    {
      text_log.Print(uuid_list[i]);
      text_log.Print("\n");
    }
    text_log.PopIndent();
  }

  text_log.Print("Values:\n");
  text_log.PushIndent();
  int value_count = ValueReport(text_log);
  if ( 0 == value_count )
    text_log.Print("none\n");
  text_log.PopIndent();
}